

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

void crnlib::rg_etc1::pack_etc1_block_init(void)

{
  uint uVar1;
  int i_1;
  int iVar2;
  ushort uVar3;
  int i;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint diff;
  ulong uVar11;
  uint uVar12;
  uint packed_c;
  uint uVar13;
  int color;
  ulong uVar14;
  bool bVar15;
  int aiStack_b8 [34];
  uint uVar4;
  
  uVar11 = 0;
  do {
    if (uVar11 == 2) {
      iVar2 = 0;
      for (uVar11 = 0; uVar11 != 0x20; uVar11 = uVar11 + 1) {
        aiStack_b8[uVar11] = ((uint)(uVar11 >> 2) & 0x3fffffff) + iVar2;
        iVar2 = iVar2 + 8;
      }
      for (lVar5 = 0; lVar5 != 0x110; lVar5 = lVar5 + 1) {
        iVar2 = 0x107;
        if ((int)lVar5 < 0x107) {
          iVar2 = (int)lVar5;
        }
        if (iVar2 < 9) {
          iVar2 = 8;
        }
        (&g_quant5_tab)[lVar5] =
             (char)aiStack_b8[(iVar2 * 0x1f + (iVar2 * 0x1f - 0x78U >> 8)) - 0x78 >> 8];
      }
      return;
    }
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        for (uVar14 = 0; uVar14 != 0x100; uVar14 = uVar14 + 1) {
          uVar12 = 0;
          uVar10 = 0;
          uVar9 = 0xffffffff;
          uVar4 = 0;
          uVar13 = 0;
          do {
            uVar3 = (ushort)uVar4;
            if ((uint)(uVar11 != 0) * 0x10 + 0x10 == uVar13) break;
            if (uVar11 == 0) {
              uVar8 = uVar10 | uVar13;
            }
            else {
              uVar8 = uVar13 >> 2 | uVar12;
            }
            uVar8 = uVar8 + (&g_etc1_inten_tables)[lVar5 * 4 + lVar7];
            if (0xfe < (int)uVar8) {
              uVar8 = 0xff;
            }
            if ((int)uVar8 < 1) {
              uVar8 = 0;
            }
            uVar6 = uVar8 - (int)uVar14;
            uVar1 = -uVar6;
            if (0 < (int)uVar6) {
              uVar1 = uVar6;
            }
            bVar15 = uVar9 <= uVar1;
            if (!bVar15) {
              uVar9 = uVar1;
              uVar4 = uVar13;
            }
            uVar3 = (ushort)uVar4;
            uVar13 = uVar13 + 1;
            uVar10 = uVar10 + 0x10;
            uVar12 = uVar12 + 8;
          } while (bVar15 || uVar14 != uVar8);
          *(ushort *)
           (g_etc1_inverse_lookup + uVar14 * 2 + (lVar7 << 4 | lVar5 * 2 | uVar11) * 0x200) =
               (ushort)(uVar9 << 8) | uVar3;
        }
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void pack_etc1_block_init()
        {
            for (uint diff = 0; diff < 2; diff++)
            {
                const uint limit = diff ? 32 : 16;

                for (uint inten = 0; inten < 8; inten++)
                {
                    for (uint selector = 0; selector < 4; selector++)
                    {
                        const uint inverse_table_index = diff + (inten << 1) + (selector << 4);
                        for (int color = 0; color < 256; color++)
                        {
                            uint best_error = cUINT32_MAX, best_packed_c = 0;
                            for (uint packed_c = 0; packed_c < limit; packed_c++)
                            {
                                int v = etc1_decode_value(diff, inten, selector, packed_c);
                                uint err = labs(v - color);
                                if (err < best_error)
                                {
                                    best_error = err;
                                    best_packed_c = packed_c;
                                    if (!best_error)
                                    {
                                        break;
                                    }
                                }
                            }
                            RG_ETC1_ASSERT(best_error <= 255);
                            g_etc1_inverse_lookup[inverse_table_index][color] = static_cast<uint16>(best_packed_c | (best_error << 8));
                        }
                    }
                }
            }

            uint expand5[32];
            for (int i = 0; i < 32; i++)
            {
                expand5[i] = (i << 3) | (i >> 2);
            }

            for (int i = 0; i < 256 + 16; i++)
            {
                int v = clamp<int>(i - 8, 0, 255);
                g_quant5_tab[i] = static_cast<uint8>(expand5[mul_8bit(v, 31)]);
            }
        }